

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

int is_fifo_and_addr_belongs(gpu_object *obj,uint64_t ctx)

{
  int iVar1;
  fifo_state *pfVar2;
  bool local_29;
  fifo_state *state;
  uint64_t ctx_local;
  gpu_object *obj_local;
  
  iVar1 = is_fifo_ib_class(obj->class_);
  if (iVar1 == 0) {
    obj_local._4_4_ = 0;
  }
  else {
    pfVar2 = get_fifo_state(obj);
    local_29 = false;
    if ((pfVar2->ib).addr <= ctx) {
      local_29 = ctx < (pfVar2->ib).addr + (pfVar2->ib).entries * 8;
    }
    obj_local._4_4_ = (uint)local_29;
  }
  return obj_local._4_4_;
}

Assistant:

int is_fifo_and_addr_belongs(struct gpu_object *obj, uint64_t ctx)
{
	if (is_fifo_ib_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->ib.addr &&
				ctx < state->ib.addr + state->ib.entries * 8;
	}

	//TODO: figure out how to get buffer boundary
	if (0 && is_fifo_dma_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->user.addr &&
				ctx < state->user.addr /*+ what?*/;
	}

	return 0;
}